

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
::Unserialize<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>>
          (Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
           *this,ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams> *s)

{
  undefined8 *puVar1;
  HashVerifier<DataStream> *this_00;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint64_t obj;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined8 **)this;
  this_00 = s->m_substream;
  DataStream::read(this_00->m_source,(int)&local_28,&DAT_00000008,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)&local_28,8);
  *puVar1 = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const { Formatter().Ser(s, m_object); }